

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O1

void av1_build_prediction_by_left_preds
               (AV1_COMMON *cm,MACROBLOCKD *xd,uint8_t **tmp_buf,int *tmp_width,int *tmp_height,
               int *tmp_stride)

{
  uint uVar1;
  int iVar2;
  MB_MODE_INFO **ppMVar3;
  MB_MODE_INFO *above_mbmi;
  byte op_mi_size;
  long lVar4;
  byte bVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  uint uVar9;
  bool bVar10;
  build_prediction_ctxt ctxt;
  
  if (xd->left_available == true) {
    ctxt.mb_to_far_edge = xd->mb_to_bottom_edge;
    ctxt.dcb = (void *)0x0;
    ppMVar3 = xd->mi;
    bVar10 = cm->seq_params->monochrome == '\0';
    uVar1 = xd->mi_row;
    iVar6 = xd->height + uVar1;
    iVar2 = (cm->mi_params).mi_rows;
    if (iVar2 <= iVar6) {
      iVar6 = iVar2;
    }
    if (((0x3dfffaUL >> ((ulong)(*ppMVar3)->bsize & 0x3f) & 1) != 0) && ((int)uVar1 < iVar6)) {
      iVar2 = max_neighbor_obmc[""[(*ppMVar3)->bsize]];
      lVar4 = (long)xd->mi_stride * (long)(int)uVar1;
      iVar8 = 0;
      ctxt.cm = cm;
      ctxt.tmp_buf = tmp_buf;
      ctxt.tmp_width = tmp_width;
      ctxt.tmp_height = tmp_height;
      ctxt.tmp_stride = tmp_stride;
      uVar9 = uVar1;
      do {
        lVar7 = (long)(int)(xd->mi_stride * uVar9);
        bVar5 = 0x10;
        if ((0x2f0bffUL >> ((ulong)ppMVar3[(lVar7 + -1) - lVar4]->bsize & 0x3f) & 1) != 0) {
          bVar5 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [ppMVar3[(lVar7 + -1) - lVar4]->bsize];
        }
        if (bVar5 == 1) {
          bVar5 = 2;
          lVar7 = (long)(int)(xd->mi_stride * (uVar9 | 1));
          uVar9 = uVar9 & 0xfffffffe;
        }
        above_mbmi = ppMVar3[(lVar7 + -1) - lVar4];
        if (((above_mbmi->field_0xa7 & 0x80) != 0) || ('\0' < above_mbmi->ref_frame[0])) {
          iVar8 = iVar8 + 1;
          op_mi_size = xd->height;
          if (bVar5 <= xd->height) {
            op_mi_size = bVar5;
          }
          build_obmc_prediction
                    (xd,uVar9 - uVar1,0,op_mi_size,1,above_mbmi,&ctxt,bVar10 + 1 + (uint)bVar10);
        }
        uVar9 = uVar9 + bVar5;
      } while (((int)uVar9 < iVar6) && (iVar8 < iVar2));
    }
  }
  return;
}

Assistant:

void av1_build_prediction_by_left_preds(const AV1_COMMON *cm, MACROBLOCKD *xd,
                                        uint8_t *tmp_buf[MAX_MB_PLANE],
                                        int tmp_width[MAX_MB_PLANE],
                                        int tmp_height[MAX_MB_PLANE],
                                        int tmp_stride[MAX_MB_PLANE]) {
  if (!xd->left_available) return;
  struct build_prediction_ctxt ctxt = {
    cm, tmp_buf, tmp_width, tmp_height, tmp_stride, xd->mb_to_bottom_edge, NULL
  };
  BLOCK_SIZE bsize = xd->mi[0]->bsize;
  foreach_overlappable_nb_left(cm, xd,
                               max_neighbor_obmc[mi_size_high_log2[bsize]],
                               build_obmc_prediction, &ctxt);
}